

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribute.c
# Opt level: O0

int mixed_make_segment_distribute(mixed_segment *segment)

{
  void *pvVar1;
  distribute_data *data;
  mixed_segment *segment_local;
  
  pvVar1 = (*mixed_calloc)(1,0x20);
  if (pvVar1 != (void *)0x0) {
    segment->free = distribute_free;
    segment->start = distribute_start;
    segment->mix = distribute_mix;
    segment->set_in = distribute_set_in;
    segment->set_out = distribute_set_out;
    segment->info = distribute_info;
    segment->data = pvVar1;
  }
  else {
    mixed_err(1);
  }
  segment_local._4_4_ = (uint)(pvVar1 != (void *)0x0);
  return segment_local._4_4_;
}

Assistant:

MIXED_EXPORT int mixed_make_segment_distribute(struct mixed_segment *segment){
  struct distribute_data *data = mixed_calloc(1, sizeof(struct distribute_data));
  if(!data){
    mixed_err(MIXED_OUT_OF_MEMORY);
    return 0;
  }
  
  segment->free = distribute_free;
  segment->start = distribute_start;
  segment->mix = distribute_mix;
  segment->set_in = distribute_set_in;
  segment->set_out = distribute_set_out;
  segment->info = distribute_info;
  segment->data = data;
  return 1;
}